

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::logFlushOrFinishAfterEnqueueStart
          (CLIntercept *this,char *flushOrFinish,char *functionName)

{
  char *in_RDX;
  char *in_RSI;
  CLIntercept *in_RDI;
  double __x;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  allocator *__rhs;
  allocator local_f9;
  string local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  allocator local_c1;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [40];
  char *local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,local_10,&local_c1);
  std::operator+((char *)in_RDI,in_stack_fffffffffffffee0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (char *)in_stack_fffffffffffffee0);
  __rhs = &local_f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,local_18,__rhs);
  std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  __x = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_RDI,(char *)__rhs);
  log(in_RDI,__x);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f542f);
  return;
}

Assistant:

void CLIntercept::logFlushOrFinishAfterEnqueueStart(
    const char* flushOrFinish,
    const char* functionName )
{
    std::lock_guard<std::mutex> lock(m_Mutex);
    log( "Calling " + std::string(flushOrFinish) + " after " + std::string(functionName) + "...\n" );
}